

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O3

char * upb_MtDecoder_Parse(upb_MtDecoder *d,char *ptr,size_t len,void *fields,size_t field_size,
                          uint16_t *field_count,upb_SubCounts *sub_counts)

{
  uint8_t *puVar1;
  upb_MiniTable *puVar2;
  byte bVar3;
  char cVar4;
  byte bVar5;
  uint16_t uVar6;
  uint uVar7;
  uint uVar8;
  upb_MiniTableField *puVar9;
  byte bVar10;
  uint uVar11;
  uint uVar12;
  uint *puVar13;
  uint uVar14;
  uint *puVar15;
  ulong uVar16;
  upb_SubCounts *puVar17;
  uint number;
  upb_OneOfLayoutItem item;
  char *pcVar18;
  ulong uVar19;
  byte *pbVar20;
  int iVar21;
  byte *pbVar22;
  byte *pbVar23;
  uint uVar24;
  byte *pbVar25;
  bool bVar26;
  bool bVar27;
  
  puVar2 = d->table;
  pbVar22 = (byte *)(ptr + len);
  (d->base).end = (char *)pbVar22;
  if ((long)len < 1) {
    if (puVar2 == (upb_MiniTable *)0x0) {
      return ptr;
    }
  }
  else {
    bVar26 = puVar2 != (upb_MiniTable *)0x0;
    puVar15 = (uint *)0x0;
    uVar7 = 0;
    uVar8 = 0;
    pbVar25 = (byte *)ptr;
    do {
      ptr = (char *)(pbVar25 + 1);
      bVar5 = *pbVar25;
      uVar19 = (ulong)(char)bVar5;
      uVar16 = (ulong)bVar5;
      if ((long)uVar19 < 0x4a) {
        if ((d->table == (upb_MiniTable *)0x0) && (puVar15 != (uint *)0x0)) {
          return (char *)pbVar25;
        }
        *field_count = *field_count + 1;
        uVar7 = uVar7 + 1;
        *(uint *)fields = uVar7;
        bVar10 = 0xff;
        if (0xa0 < (byte)(bVar5 + 0x81)) {
          bVar10 = ""[(int)(char)bVar5 - 0x20];
        }
        cVar4 = (d->platform != kUpb_MiniTablePlatform_32Bit) * '\x02' + '\x01';
        if (bVar5 < 0x36) {
          *(undefined1 *)((long)fields + 0xb) = 2;
          *(undefined2 *)((long)fields + 4) = 1;
          if ((bVar10 & 0xfe) != 0x10) {
            if (0x12 < bVar10) goto LAB_002f92c0;
            bVar5 = upb_MiniTable_SetField_kUpb_EncodedToFieldRep[bVar10] << 6 | 2;
            *(byte *)((long)fields + 0xb) = bVar5;
            goto LAB_002f913c;
          }
          bVar5 = cVar4 * '@' | 2;
          *(byte *)((long)fields + 0xb) = bVar5;
LAB_002f9169:
          bVar10 = "\x01\x02\a\x06\x0f\x10\x05\r\x11\x03\x04\x12\x0e\b\f\t\n\v\x0e"[bVar10];
        }
        else {
          bVar10 = bVar10 - 0x14;
          bVar5 = cVar4 * '@' + 1;
          *(byte *)((long)fields + 0xb) = bVar5;
          *(undefined2 *)((long)fields + 4) = 0;
          if (0x12 < bVar10) {
LAB_002f92c0:
            uVar16 = (ulong)(uint)(int)(char)bVar10;
            pcVar18 = "Invalid field type: %d";
LAB_002f9373:
            upb_MdDecoder_ErrorJmp(&d->base,pcVar18,uVar16);
          }
LAB_002f913c:
          bVar3 = 5;
          if (bVar10 == 0xc) {
LAB_002f9146:
            bVar10 = bVar3;
            bVar5 = bVar5 | 0x10;
            *(byte *)((long)fields + 0xb) = bVar5;
          }
          else {
            if (bVar10 != 0xf) goto LAB_002f9169;
            bVar10 = 9;
            bVar3 = 0xc;
            if ((uVar8 & 1) == 0) goto LAB_002f9146;
          }
        }
        *(byte *)((long)fields + 10) = bVar10;
        if ((((bVar5 & 1) != 0) && ((uVar8 & 2) != 0)) &&
           ((1 << (bVar10 & 0x1f) & 0xffffe1ffU) != 0)) {
          *(byte *)((long)fields + 0xb) = bVar5 | 4;
        }
        puVar17 = sub_counts;
        if (((bVar10 & 0xfe) == 10) ||
           (uVar6 = 0xffff, puVar17 = (upb_SubCounts *)&sub_counts->subenum_count, bVar10 == 0xe)) {
          uVar6 = puVar17->submsg_count;
          puVar17->submsg_count = uVar6 + 1;
        }
        *(uint16_t *)((long)fields + 8) = uVar6;
        puVar13 = (uint *)((long)fields + field_size);
        puVar15 = (uint *)fields;
      }
      else {
        puVar13 = (uint *)fields;
        if ((byte)(bVar5 + 0xb4) < 0x10) {
          for (uVar24 = 0x1f; 0xeU >> uVar24 == 0; uVar24 = uVar24 - 1) {
          }
          uVar14 = 0;
          uVar11 = 0;
          pbVar25 = (byte *)ptr;
          while ((uVar14 = ""[((uint)uVar19 & 0xff) - 0x20] + -0x2a << ((byte)uVar11 & 0x1f) |
                           uVar14, ptr = (char *)pbVar22, pbVar25 != pbVar22 &&
                 (uVar19 = (ulong)*pbVar25, ptr = (char *)pbVar25, 0xef < (byte)(*pbVar25 + 0xa4))))
          {
            pbVar25 = pbVar25 + 1;
            uVar11 = uVar11 + (uVar24 ^ 0xffffffe0) + 0x21;
            if (0x1f < uVar11) goto LAB_002f9276;
          }
          if (puVar15 == (uint *)0x0) {
            uVar8 = uVar14;
            if (d->table == (upb_MiniTable *)0x0) {
              pcVar18 = "Extensions cannot have message modifiers";
              goto LAB_002f9280;
            }
          }
          else {
            if ((uVar14 & 1) != 0) {
              if (((*(byte *)((long)puVar15 + 0xb) & 1) == 0) ||
                 ((0xffffe1ffU >> (*(byte *)((long)puVar15 + 10) & 0x1f) & 1) == 0)) {
                uVar16 = (ulong)*puVar15;
                pcVar18 = "Cannot flip packed on unpackable field %u";
                goto LAB_002f9373;
              }
              *(byte *)((long)puVar15 + 0xb) = *(byte *)((long)puVar15 + 0xb) ^ 4;
            }
            if ((uVar14 & 8) != 0) {
              if ((*(char *)((long)puVar15 + 10) != '\f') ||
                 ((*(byte *)((long)puVar15 + 0xb) & 0x10) == 0)) {
                upb_MdDecoder_ErrorJmp
                          (&d->base,"Cannot flip ValidateUtf8 on field %u, type=%d, mode=%d",
                           (ulong)*puVar15);
              }
              *(undefined1 *)((long)puVar15 + 10) = 9;
              *(byte *)((long)puVar15 + 0xb) = *(byte *)((long)puVar15 + 0xb) & 0xef;
            }
            if ((uVar14 & 6) != 0) {
              if ((short)puVar15[1] != 1) {
                uVar16 = (ulong)*puVar15;
                pcVar18 = "Invalid modifier(s) for repeated field %u";
                goto LAB_002f9373;
              }
              if ((uVar14 & 6) == 6) {
                uVar16 = (ulong)*puVar15;
                pcVar18 = "Field %u cannot be both singular and required";
                goto LAB_002f9373;
              }
              if ((uVar14 & 4) != 0) {
                if ((*(byte *)((long)puVar15 + 10) & 0xfe) == 10) {
                  uVar16 = (ulong)*puVar15;
                  pcVar18 = "Field %u cannot be a singular submessage";
                  goto LAB_002f9373;
                }
                *(undefined2 *)(puVar15 + 1) = 0;
              }
              if ((uVar14 & 2) != 0) {
                *(undefined2 *)(puVar15 + 1) = 2;
              }
            }
          }
          if ((uVar8 & 4) != 0) {
            puVar1 = &d->table->ext_dont_copy_me__upb_internal_use_only;
            *puVar1 = *puVar1 | 1;
          }
        }
        else if (bVar5 == 0x5e) {
          if (d->table == (upb_MiniTable *)0x0) {
            pcVar18 = "Extensions cannot have oneofs.";
            goto LAB_002f9280;
          }
          item.field_index = 0xffff;
          item.rep = '\0';
          item._3_1_ = 0;
          if (ptr < pbVar22) {
            uVar11 = 0xffff;
            uVar24 = 0;
            do {
              bVar5 = *ptr;
              pbVar25 = (byte *)ptr + 1;
              ptr = (char *)pbVar25;
              if (bVar5 != 0x7c) {
                if (bVar5 != 0x7e) {
                  for (uVar14 = 0x1f; 0x3eU >> uVar14 == 0; uVar14 = uVar14 - 1) {
                  }
                  number = 0;
                  uVar12 = 0;
                  while( true ) {
                    iVar21 = -1;
                    if (0xa0 < (byte)(bVar5 + 0x81)) {
                      iVar21 = (int)""[bVar5 - 0x20];
                    }
                    number = number | iVar21 << ((byte)uVar12 & 0x1f);
                    ptr = (char *)pbVar22;
                    if ((pbVar25 == pbVar22) ||
                       (bVar5 = *pbVar25, ptr = (char *)pbVar25, (byte)(bVar5 + 0x9d) < 0xbd))
                    break;
                    pbVar25 = pbVar25 + 1;
                    uVar12 = uVar12 + (uVar14 ^ 0xffffffe0) + 0x21;
                    if (0x1f < uVar12) {
                      pcVar18 = "Overlong varint";
                      goto LAB_002f9280;
                    }
                  }
                  puVar9 = upb_MiniTable_FindFieldByNumber(d->table,number);
                  if (puVar9 == (upb_MiniTableField *)0x0) {
                    pcVar18 = "Couldn\'t add field number %u to oneof, no such field number.";
                  }
                  else {
                    if (puVar9->offset_dont_copy_me__upb_internal_use_only == 1) {
                      uVar14 = (uint)(puVar9->mode_dont_copy_me__upb_internal_use_only >> 6);
                      pbVar22 = &upb_MtDecoder_AlignOfRep_kRepToAlign64 + uVar24;
                      pbVar25 = &upb_MtDecoder_AlignOfRep_kRepToAlign32 + uVar24;
                      bVar27 = d->platform != kUpb_MiniTablePlatform_32Bit;
                      pbVar20 = &upb_MtDecoder_SizeOfRep_kRepToSize64 + uVar14;
                      if (!bVar27) {
                        pbVar20 = &upb_MtDecoder_AlignOfRep_kRepToAlign64 + uVar14;
                      }
                      pbVar23 = &upb_MtDecoder_AlignOfRep_kRepToAlign32 + uVar14;
                      if (bVar27) {
                        pbVar23 = &upb_MtDecoder_AlignOfRep_kRepToAlign64 + uVar14;
                      }
                      bVar5 = *pbVar23;
                      if (bVar27) {
                        pbVar25 = pbVar22;
                        pbVar22 = &upb_MtDecoder_SizeOfRep_kRepToSize64 + uVar24;
                      }
                      bVar10 = *pbVar25;
                      if ((*pbVar22 < *pbVar20) || ((*pbVar20 == *pbVar22 && (bVar10 < bVar5)))) {
                        uVar24 = uVar14;
                        if (bVar5 < bVar10) {
                          __assert_fail("new_align >= current_align",
                                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mini_descriptor/decode.c"
                                        ,0x15f,
                                        "const char *upb_MtDecoder_DecodeOneofField(upb_MtDecoder *, const char *, char, upb_OneOfLayoutItem *)"
                                       );
                        }
                      }
                      else if (bVar10 < bVar5) {
                        __assert_fail("current_align >= new_align",
                                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mini_descriptor/decode.c"
                                      ,0x162,
                                      "const char *upb_MtDecoder_DecodeOneofField(upb_MtDecoder *, const char *, char, upb_OneOfLayoutItem *)"
                                     );
                      }
                      puVar9->offset_dont_copy_me__upb_internal_use_only = (uint16_t)uVar11;
                      uVar11 = ((uint)((int)puVar9 - *(int *)&d->fields) >> 2) * -0x5555 + 3;
                      goto LAB_002f8f4e;
                    }
                    pcVar18 = "Cannot add repeated, required, or singular field %u to oneof.";
                  }
                  uVar16 = (ulong)number;
                  goto LAB_002f9373;
                }
                upb_MtDecoder_PushOneof(d,(upb_OneOfLayoutItem)(uVar11 & 0xffff | uVar24 << 0x10));
                uVar11 = 0xffff;
              }
LAB_002f8f4e:
              pbVar22 = (byte *)(d->base).end;
            } while (ptr < pbVar22);
            item = (upb_OneOfLayoutItem)(uVar11 & 0xffff | uVar24 << 0x10);
          }
          upb_MtDecoder_PushOneof(d,item);
        }
        else {
          if (0x1f < (byte)(bVar5 + 0xa1)) {
            pcVar18 = "Invalid char: %c";
            goto LAB_002f9373;
          }
          if (bVar26) {
            d->table->dense_below_dont_copy_me__upb_internal_use_only =
                 (uint8_t)d->table->field_count_dont_copy_me__upb_internal_use_only;
            pbVar22 = (byte *)(d->base).end;
            bVar26 = false;
          }
          for (uVar24 = 0x1f; 0x1eU >> uVar24 == 0; uVar24 = uVar24 - 1) {
          }
          uVar14 = 0;
          uVar11 = 0;
          while (uVar14 = ""[((uint)uVar19 & 0xff) - 0x20] + -0x3c << ((byte)uVar11 & 0x1f) | uVar14
                , (byte *)ptr != pbVar22) {
            uVar19 = (ulong)(byte)*ptr;
            if ((byte)(*ptr + 0x81U) < 0xe0) goto LAB_002f91f0;
            ptr = (char *)((byte *)ptr + 1);
            uVar11 = uVar11 + (uVar24 ^ 0xffffffe0) + 0x21;
            if (0x1f < uVar11) goto LAB_002f9276;
          }
          ptr = (char *)pbVar22;
          if (pbVar22 == (byte *)0x0) {
            __assert_fail("ptr != ((void*)0)",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mini_descriptor/internal/base92.h"
                          ,0x30,
                          "const char *_upb_Base92_DecodeVarint(const char *, const char *, char, uint8_t, uint8_t, uint32_t *)"
                         );
          }
LAB_002f91f0:
          uVar7 = (uVar7 + uVar14) - 1;
        }
      }
      pbVar22 = (byte *)(d->base).end;
      pbVar25 = (byte *)ptr;
      fields = puVar13;
    } while (ptr < pbVar22);
    if (!bVar26) {
      return (char *)(byte *)ptr;
    }
  }
  d->table->dense_below_dont_copy_me__upb_internal_use_only =
       (uint8_t)d->table->field_count_dont_copy_me__upb_internal_use_only;
  return (char *)(byte *)ptr;
LAB_002f9276:
  pcVar18 = "Overlong varint";
LAB_002f9280:
  upb_MdDecoder_ErrorJmp(&d->base,pcVar18);
}

Assistant:

static const char* upb_MtDecoder_Parse(upb_MtDecoder* d, const char* ptr,
                                       size_t len, void* fields,
                                       size_t field_size, uint16_t* field_count,
                                       upb_SubCounts* sub_counts) {
  uint64_t msg_modifiers = 0;
  uint32_t last_field_number = 0;
  upb_MiniTableField* last_field = NULL;
  bool need_dense_below = d->table != NULL;

  d->base.end = UPB_PTRADD(ptr, len);

  while (ptr < d->base.end) {
    char ch = *ptr++;
    if (ch <= kUpb_EncodedValue_MaxField) {
      if (!d->table && last_field) {
        // For extensions, consume only a single field and then return.
        return --ptr;
      }
      upb_MiniTableField* field = fields;
      *field_count += 1;
      fields = (char*)fields + field_size;
      field->UPB_PRIVATE(number) = ++last_field_number;
      last_field = field;
      upb_MiniTable_SetField(d, ch, field, msg_modifiers, sub_counts);
    } else if (kUpb_EncodedValue_MinModifier <= ch &&
               ch <= kUpb_EncodedValue_MaxModifier) {
      ptr = upb_MtDecoder_ParseModifier(d, ptr, ch, last_field, &msg_modifiers);
      if (msg_modifiers & kUpb_MessageModifier_IsExtendable) {
        d->table->UPB_PRIVATE(ext) |= kUpb_ExtMode_Extendable;
      }
    } else if (ch == kUpb_EncodedValue_End) {
      if (!d->table) {
        upb_MdDecoder_ErrorJmp(&d->base, "Extensions cannot have oneofs.");
      }
      ptr = upb_MtDecoder_DecodeOneofs(d, ptr);
    } else if (kUpb_EncodedValue_MinSkip <= ch &&
               ch <= kUpb_EncodedValue_MaxSkip) {
      if (need_dense_below) {
        d->table->UPB_PRIVATE(dense_below) = d->table->UPB_PRIVATE(field_count);
        need_dense_below = false;
      }
      uint32_t skip;
      ptr = upb_MdDecoder_DecodeBase92Varint(&d->base, ptr, ch,
                                             kUpb_EncodedValue_MinSkip,
                                             kUpb_EncodedValue_MaxSkip, &skip);
      last_field_number += skip;
      last_field_number--;  // Next field seen will increment.
    } else {
      upb_MdDecoder_ErrorJmp(&d->base, "Invalid char: %c", ch);
    }
  }

  if (need_dense_below) {
    d->table->UPB_PRIVATE(dense_below) = d->table->UPB_PRIVATE(field_count);
  }

  return ptr;
}